

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O2

void __thiscall
nuraft::nuraft_global_mgr::append_worker_loop(nuraft_global_mgr *this,ptr<worker_handle> *handle)

{
  list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
  *this_00;
  _List_node_base *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  int iVar4;
  pthread_t __target_thread;
  size_t sVar5;
  lock_guard<std::mutex> l;
  bool bVar6;
  ptr<raft_server> target;
  string local_70;
  string thread_name;
  
  std::__cxx11::to_string
            (&local_70,
             ((handle->
              super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->id_);
  std::operator+(&thread_name,"nuraft_g_a",&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,thread_name._M_dataplus._M_p);
  this_00 = &this->append_queue_;
  bVar6 = false;
  while (((((handle->
            super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr)->stopping_)._M_base._M_i & 1U) == 0) {
    if (!bVar6) {
      LOCK();
      (((handle->
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->status_)._M_i = SLEEPING;
      UNLOCK();
      EventAwaiter::wait_us
                (&((handle->
                   super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->ea_,1000000);
      LOCK();
      (((handle->
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->ea_).status._M_i = idle;
      UNLOCK();
      LOCK();
      (((handle->
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->status_)._M_i = WORKING;
      UNLOCK();
    }
    if (((((handle->
           super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>)
          ._M_ptr)->stopping_)._M_base._M_i & 1U) != 0) break;
    target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::mutex::lock(&this->append_queue_lock_);
    p_Var1 = (this_00->
             super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)this_00) {
      bVar6 = false;
      sVar5 = 0;
    }
    else {
      std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)(p_Var1 + 1));
      std::
      _Hashtable<std::shared_ptr<nuraft::raft_server>,_std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase(&(this->append_server_set_)._M_h,&target);
      std::__cxx11::
      list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
      ::pop_front(this_00);
      sVar5 = (this->append_queue_).
              super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
              ._M_impl._M_node._M_size;
      bVar6 = (this->append_queue_).
              super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
              ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this_00;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->append_queue_lock_);
    peVar3 = target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      peVar2 = ((target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar4 = (*peVar2->_vptr_logger[7])();
        if (5 < iVar4) {
          peVar2 = (peVar3->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_70,"executed append_entries by global worker, queue length %zu",sVar5);
          (*peVar2->_vptr_logger[8])
                    (peVar2,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                     ,"append_worker_loop",0x187,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
        }
      }
      bVar6 = true;
      raft_server::append_entries_in_bg_exec
                (target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&target.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__cxx11::string::~string((string *)&thread_name);
  return;
}

Assistant:

void nuraft_global_mgr::append_worker_loop(ptr<worker_handle> handle) {
    std::string thread_name = "nuraft_g_a" + std::to_string(handle->id_);
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    bool skip_sleeping = false;
    while (!handle->stopping_) {
        if (!skip_sleeping) {
            handle->status_ = worker_handle::SLEEPING;
            // Ditto, just in case.
            handle->ea_.wait_ms(1000);
            handle->ea_.reset();
            handle->status_ = worker_handle::WORKING;
        }
        if (handle->stopping_) break;

        skip_sleeping = false;
        size_t queue_length = 0;
        ptr<raft_server> target = nullptr;
        {
            std::lock_guard<std::mutex> l(append_queue_lock_);
            auto entry = append_queue_.begin();
            if (entry != append_queue_.end()) {
                target = *entry;
                append_server_set_.erase(target);
                append_queue_.pop_front();
                queue_length = append_queue_.size();
                if (!append_queue_.empty()) {
                    // Other requests are waiting in the queue,
                    // skip sleeping next time.
                    skip_sleeping = true;
                }
            }
        }
        if (!target) continue;

        ptr<logger>& l_ = target->l_;

        // Whenever we find a task to execute, skip next sleeping for any tasks
        // that can be queued in the meantime.
        skip_sleeping = true;

        p_tr("executed append_entries by global worker, queue length %zu",
             queue_length);
        target->append_entries_in_bg_exec();
    }
}